

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

WildcardPortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WildcardPortListSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,Token *args_3)

{
  Token dot;
  Token star;
  Token closeParen;
  WildcardPortListSyntax *pWVar1;
  long in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Token *in_R8;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  pWVar1 = (WildcardPortListSyntax *)
           allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  dot.info = (Info *)pWVar1;
  dot._0_8_ = in_stack_ffffffffffffff88;
  star.info = (Info *)*in_RDX;
  star._0_8_ = *(undefined8 *)(in_RCX + 8);
  closeParen.info = (Info *)*in_RSI;
  closeParen._0_8_ = in_RDX[1];
  slang::syntax::WildcardPortListSyntax::WildcardPortListSyntax
            ((WildcardPortListSyntax *)in_R8->info,*in_R8,dot,star,closeParen);
  return pWVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }